

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

span<const_slang::ast::Expression_*const,_18446744073709551615UL>
slang::ast::createUninstantiatedParams(HierarchyInstantiationSyntax *syntax,ASTContext *context)

{
  sockaddr *psVar1;
  bool bVar2;
  int iVar3;
  ExpressionSyntax *pEVar4;
  undefined4 extraout_var;
  NamedParamAssignmentSyntax *pNVar5;
  undefined4 extraout_var_00;
  Compilation *this;
  undefined4 extraout_var_01;
  EVP_PKEY_CTX *src;
  sockaddr *in_RSI;
  long in_RDI;
  ExpressionSyntax *ex;
  ParamAssignmentSyntax *expr;
  iterator __end3;
  iterator __begin3;
  SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *__range3;
  SmallVector<const_slang::ast::Expression_*,_5UL> params;
  iterator_base<slang::syntax::ParamAssignmentSyntax_*> *in_stack_fffffffffffffe98;
  SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *in_stack_fffffffffffffea0;
  bitmask<slang::ast::ASTFlags> local_c8;
  undefined8 local_c0;
  ExpressionSyntax *local_b8;
  bitmask<slang::ast::ASTFlags> local_b0;
  undefined8 local_a8;
  SyntaxNode *local_a0;
  iterator local_98;
  iterator local_78;
  long local_68;
  SmallVectorBase<const_slang::ast::Expression_*> local_60 [2];
  sockaddr *local_20;
  long local_18;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_10;
  
  local_20 = in_RSI;
  local_18 = in_RDI;
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x8d9134);
  if (*(long *)(local_18 + 0x60) != 0) {
    local_68 = *(long *)(local_18 + 0x60) + 0x38;
    local_78 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::begin
                         ((SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *)0x8d916c);
    local_98 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::end
                         (in_stack_fffffffffffffea0);
    while( true ) {
      bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::iterator_base<slang::syntax::ParamAssignmentSyntax_*>_>
                        ((self_type *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      local_a0 = &iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::iterator_base<slang::syntax::ParamAssignmentSyntax_*>,_false>
                  ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::iterator_base<slang::syntax::ParamAssignmentSyntax_*>,_false>
                               *)0x8d9208)->super_SyntaxNode;
      if (local_a0->kind == OrderedParamAssignment) {
        slang::syntax::SyntaxNode::as<slang::syntax::OrderedParamAssignmentSyntax>(local_a0);
        pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                           ((not_null<slang::syntax::ExpressionSyntax_*> *)0x8d9252);
        psVar1 = local_20;
        bitmask<slang::ast::ASTFlags>::bitmask(&local_b0,None);
        iVar3 = Expression::bind((int)pEVar4,psVar1,(socklen_t)local_b0.m_bits);
        local_a8 = CONCAT44(extraout_var,iVar3);
        SmallVectorBase<const_slang::ast::Expression_*>::push_back
                  ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffffea0,
                   (Expression **)in_stack_fffffffffffffe98);
      }
      else if (local_a0->kind == NamedParamAssignment) {
        pNVar5 = slang::syntax::SyntaxNode::as<slang::syntax::NamedParamAssignmentSyntax>(local_a0);
        psVar1 = local_20;
        pEVar4 = pNVar5->expr;
        local_b8 = pEVar4;
        if (pEVar4 != (ExpressionSyntax *)0x0) {
          bitmask<slang::ast::ASTFlags>::bitmask(&local_c8,AllowDataType);
          iVar3 = Expression::bind((int)pEVar4,psVar1,(socklen_t)local_c8.m_bits);
          local_c0 = CONCAT44(extraout_var_00,iVar3);
          SmallVectorBase<const_slang::ast::Expression_*>::push_back
                    ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffffea0,
                     (Expression **)in_stack_fffffffffffffe98);
        }
      }
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::iterator_base<slang::syntax::ParamAssignmentSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::iterator_base<slang::syntax::ParamAssignmentSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::iterator_base<slang::syntax::ParamAssignmentSyntax_*>,_false>
                  *)in_stack_fffffffffffffea0);
    }
  }
  this = ASTContext::getCompilation((ASTContext *)0x8d93c1);
  iVar3 = SmallVectorBase<const_slang::ast::Expression_*>::copy(local_60,(EVP_PKEY_CTX *)this,src);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
  span<const_slang::ast::Expression_*,_18446744073709551615UL>
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)this,
             (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)
             CONCAT44(extraout_var_01,iVar3));
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x8d9422);
  return local_10;
}

Assistant:

static std::span<const Expression* const> createUninstantiatedParams(
    const HierarchyInstantiationSyntax& syntax, const ASTContext& context) {

    SmallVector<const Expression*> params;
    if (syntax.parameters) {
        for (auto expr : syntax.parameters->parameters) {
            // Empty expressions are just ignored here.
            if (expr->kind == SyntaxKind::OrderedParamAssignment) {
                params.push_back(
                    &Expression::bind(*expr->as<OrderedParamAssignmentSyntax>().expr, context));
            }
            else if (expr->kind == SyntaxKind::NamedParamAssignment) {
                if (auto ex = expr->as<NamedParamAssignmentSyntax>().expr)
                    params.push_back(&Expression::bind(*ex, context, ASTFlags::AllowDataType));
            }
        }
    }

    return params.copy(context.getCompilation());
}